

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

overlap_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::find
          (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this,unsigned_long left,
          unsigned_long right)

{
  overlap_iterator *in_RDI;
  overlap_iterator *it;
  overlap_iterator *this_00;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *in_stack_ffffffffffffffc8;
  overlap_iterator *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  overlap_iterator::overlap_iterator
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(unsigned_long)in_RDI,
             (unsigned_long)in_RDI);
  overlap_iterator::setToBegin(this_00);
  return in_RDI;
}

Assistant:

overlap_iterator find(TKey left, TKey right) const {
        overlap_iterator it(*this, left, right);
        it.setToBegin();
        return it;
    }